

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Bit_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (this->length >> 0xd) * M->bit_0_prob;
  uVar1 = this->value;
  uVar2 = uVar3;
  if (uVar3 <= uVar1) {
    this->value = uVar1 - uVar3;
    uVar2 = this->length - uVar3;
  }
  this->length = uVar2;
  if (uVar2 < 0x1000000) {
    renorm_dec_interval(this);
  }
  return (uint)(uVar3 <= uVar1);
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                        // update & shift interval
      if (bit == 0)
        length  = x;
      else {
        value  -= x;                                 // shifted interval base = 0
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }